

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

void __thiscall
icu_63::AnnualTimeZoneRule::AnnualTimeZoneRule
          (AnnualTimeZoneRule *this,UnicodeString *name,int32_t rawOffset,int32_t dstSavings,
          DateTimeRule *dateTimeRule,int32_t startYear,int32_t endYear)

{
  DateTimeRule *this_00;
  
  TimeZoneRule::TimeZoneRule(&this->super_TimeZoneRule,name,rawOffset,dstSavings);
  (this->super_TimeZoneRule).super_UObject._vptr_UObject =
       (_func_int **)&PTR__AnnualTimeZoneRule_003e60f0;
  this_00 = (DateTimeRule *)UMemory::operator_new((UMemory *)0x28,(size_t)name);
  if (this_00 == (DateTimeRule *)0x0) {
    this_00 = (DateTimeRule *)0x0;
  }
  else {
    DateTimeRule::DateTimeRule(this_00,dateTimeRule);
  }
  this->fDateTimeRule = this_00;
  this->fStartYear = startYear;
  this->fEndYear = endYear;
  return;
}

Assistant:

AnnualTimeZoneRule::AnnualTimeZoneRule(const UnicodeString& name,
                                       int32_t rawOffset,
                                       int32_t dstSavings, 
                                       const DateTimeRule& dateTimeRule,
                                       int32_t startYear,
                                       int32_t endYear)
: TimeZoneRule(name, rawOffset, dstSavings), fDateTimeRule(new DateTimeRule(dateTimeRule)),
  fStartYear(startYear), fEndYear(endYear) {
}